

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O0

void __thiscall
AssemblyCode::MoveRegMemCommand::MoveRegMemCommand
          (MoveRegMemCommand *this,CTemp *target,CTemp *source)

{
  CTemp *source_local;
  CTemp *target_local;
  MoveRegMemCommand *this_local;
  
  AssemblyCommand::AssemblyCommand(&this->super_AssemblyCommand);
  (this->super_AssemblyCommand)._vptr_AssemblyCommand = (_func_int **)&PTR_GetIn_00239cf8;
  IRT::CTemp::CTemp(&this->target,target);
  IRT::CTemp::CTemp(&this->source,source);
  return;
}

Assistant:

AssemblyCode::MoveRegMemCommand::MoveRegMemCommand( const IRT::CTemp &target, const IRT::CTemp &source ) : target(
        target ), source( source ) { }